

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_gcc_x86.hpp
# Opt level: O0

int boost::detail::atomic_exchange_and_add(int *pw,int dv)

{
  int iVar1;
  int r;
  int dv_local;
  int *pw_local;
  
  LOCK();
  iVar1 = *pw;
  *pw = *pw + dv;
  UNLOCK();
  return iVar1;
}

Assistant:

inline int atomic_exchange_and_add( int * pw, int dv )
{
    // int r = *pw;
    // *pw += dv;
    // return r;

    int r;

    __asm__ __volatile__
    (
        "lock\n\t"
        "xadd %1, %0":
        "=m"( *pw ), "=r"( r ): // outputs (%0, %1)
        "m"( *pw ), "1"( dv ): // inputs (%2, %3 == %1)
        "memory", "cc" // clobbers
    );

    return r;
}